

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagStackFrame.cpp
# Opt level: O0

FrameDisplay * __thiscall Js::DiagStackFrame::GetFrameDisplay(DiagStackFrame *this)

{
  code *pcVar1;
  bool bVar2;
  RegSlot RVar3;
  int iVar4;
  FunctionBody *pFVar5;
  undefined4 *puVar6;
  undefined4 extraout_var;
  ScriptFunction *this_00;
  FrameDisplay *pFStack_18;
  RegSlot frameDisplayReg;
  FrameDisplay *display;
  DiagStackFrame *this_local;
  
  pFVar5 = GetFunction(this);
  if (pFVar5 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagStackFrame.cpp"
                                ,0x47,"(this->GetFunction() != __null)",
                                "this->GetFunction() != NULL");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pFVar5 = GetFunction(this);
  RVar3 = FunctionBody::GetFrameDisplayRegister(pFVar5);
  if ((RVar3 == 0xffffffff) || (RVar3 == 0)) {
    this_00 = GetScriptFunction(this);
    pFStack_18 = ScriptFunction::GetEnvironment(this_00);
  }
  else {
    iVar4 = (*this->_vptr_DiagStackFrame[6])(this,(ulong)RVar3);
    pFStack_18 = (FrameDisplay *)CONCAT44(extraout_var,iVar4);
  }
  return pFStack_18;
}

Assistant:

FrameDisplay * DiagStackFrame::GetFrameDisplay()
    {
        FrameDisplay *display = NULL;

        Assert(this->GetFunction() != NULL);
        RegSlot frameDisplayReg = this->GetFunction()->GetFrameDisplayRegister();

        if (frameDisplayReg != Js::Constants::NoRegister && frameDisplayReg != 0)
        {
            display = (FrameDisplay*)this->GetNonVarRegValue(frameDisplayReg);
        }
        else
        {
            display = this->GetScriptFunction()->GetEnvironment();
        }

        return display;
    }